

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_passModelName(void *highs,char *name)

{
  HighsStatus HVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  HVar1 = Highs::passModelName((Highs *)highs,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return HVar1;
}

Assistant:

HighsInt Highs_passModelName(const void* highs, const char* name) {
  return (HighsInt)((Highs*)highs)->passModelName(std::string(name));
}